

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

double duckdb::NoInfiniteNoZeroDoubleWrapper<duckdb::CotOperator>::Operation<double,double>
                 (double input)

{
  OutOfRangeException *pOVar1;
  bool bVar2;
  double dVar3;
  string local_40;
  
  bVar2 = Value::IsFinite<double>(input);
  if (bVar2) {
    if ((input == 0.0) && (!NAN(input))) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "input value %lf is out of range for numeric function cotangent","");
      OutOfRangeException::OutOfRangeException<double>(pOVar1,&local_40,input);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar3 = tan(input);
    input = 1.0 / dVar3;
  }
  else {
    bVar2 = Value::IsNan<double>(input);
    if (!bVar2) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"input value %lf is out of range for numeric function","");
      OutOfRangeException::OutOfRangeException<double>(pOVar1,&local_40,input);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  return input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		if (DUCKDB_UNLIKELY(!Value::IsFinite(input))) {
			if (Value::IsNan(input)) {
				return input;
			}
			throw OutOfRangeException("input value %lf is out of range for numeric function", input);
		}
		if (DUCKDB_UNLIKELY((double)input == 0.0 || (double)input == -0.0)) {
			throw OutOfRangeException("input value %lf is out of range for numeric function cotangent", input);
		}
		return OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input);
	}